

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

void parse_feature_tweaks(options_i *options,vw *all)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *location;
  vw_ostream *pvVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_t i_3;
  option_group_definition *poVar7;
  typed_option<unsigned_int> *op;
  hash_func_t p_Var8;
  long lVar9;
  ostream *poVar10;
  byte *pbVar11;
  char *pcVar12;
  vw_exception *pvVar13;
  byte *pbVar14;
  size_type sVar15;
  byte bVar16;
  size_t i;
  long lVar17;
  char cVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ignore;
  pointer pbVar20;
  pointer pbVar21;
  uchar uVar22;
  size_t i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i_2;
  pointer pbVar23;
  ulong uVar24;
  bool bVar25;
  bool leave_duplicate_interactions;
  bool noconstant;
  vw *local_1830;
  allocator local_1827;
  allocator local_1826;
  allocator local_1825;
  allocator local_1824;
  allocator local_1823;
  allocator local_1822;
  allocator local_1821;
  allocator local_1820;
  allocator local_181f;
  allocator local_181e;
  allocator local_181d;
  allocator local_181c;
  allocator local_181b;
  allocator local_181a;
  allocator local_1819;
  allocator local_1818;
  allocator local_1817;
  allocator local_1816;
  allocator local_1815;
  allocator local_1814;
  allocator local_1813;
  allocator local_1812;
  allocator local_1811;
  allocator local_1810;
  allocator local_180f;
  allocator local_180e;
  allocator local_180d;
  allocator local_180c;
  allocator local_180b;
  allocator local_180a;
  allocator local_1809;
  allocator local_1808;
  allocator local_1807;
  allocator local_1806;
  allocator local_1805;
  allocator local_1804;
  allocator local_1803;
  allocator local_1802;
  allocator local_1801;
  allocator local_1800;
  allocator local_17ff;
  allocator local_17fe;
  allocator local_17fd;
  allocator local_17fc;
  allocator local_17fb;
  allocator local_17fa;
  allocator local_17f9;
  pointer local_17f8;
  uint32_t new_bits;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignore_linears;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignores;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  spelling_ns;
  stringstream __msg;
  _Alloc_hider local_1768;
  undefined1 local_1760 [96];
  bool local_1700;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exp_cubic;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interactions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cubics;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  quadratics;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dictionary_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dictionary_nses;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  redefines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1490;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1478;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1460;
  string affix;
  string hash_function;
  string local_1408;
  string local_13e8 [32];
  string local_13c8;
  string local_13a8 [32];
  string local_1388;
  string local_1368 [32];
  string local_1348 [32];
  string local_1328;
  string local_1308 [32];
  string local_12e8;
  string local_12c8 [32];
  string local_12a8;
  string local_1288 [32];
  string local_1268;
  string local_1248 [32];
  string local_1228;
  string local_1208 [32];
  string local_11e8;
  string local_11c8 [32];
  string local_11a8;
  string local_1188 [32];
  string local_1168;
  string local_1148 [32];
  string local_1128;
  string local_1108 [32];
  string local_10e8;
  string local_10c8 [32];
  string local_10a8;
  string local_1088 [32];
  string local_1068 [32];
  string local_1048;
  string local_1028 [32];
  string local_1008;
  string local_fe8 [32];
  string local_fc8 [32];
  string local_fa8;
  string local_f88 [32];
  string local_f68;
  string local_f48 [32];
  string local_f28;
  string local_f08 [32];
  string local_ee8;
  string local_ec8 [32];
  string local_ea8;
  string local_e88 [32];
  string local_e68;
  string local_e48 [32];
  string local_e28;
  string local_e08;
  string q_colon;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expanded_interactions;
  string local_d98 [64];
  bool local_d58;
  string local_d28;
  string local_d08;
  string local_ce8;
  string local_cc8;
  option_group_definition feature_options;
  undefined1 local_c70 [112];
  bool local_c00;
  string local_bd0;
  string local_bb0;
  undefined1 local_b90 [80];
  string local_b40 [32];
  bool local_b20;
  undefined1 local_af0 [80];
  string local_aa0 [80];
  undefined1 local_a50 [112];
  bool local_9e0;
  undefined1 local_9b0 [112];
  bool local_940;
  undefined1 local_910 [112];
  bool local_8a0;
  undefined1 local_870 [112];
  bool local_800;
  undefined1 local_7d0 [112];
  bool local_760;
  undefined1 local_730 [112];
  bool local_6c0;
  undefined1 local_690 [112];
  bool local_620;
  undefined1 local_5f0 [80];
  string local_5a0 [80];
  string local_550;
  undefined1 local_530 [160];
  undefined1 local_490 [160];
  undefined1 local_3f0 [160];
  undefined1 local_350 [160];
  undefined1 local_2b0 [160];
  undefined1 local_210 [160];
  undefined1 local_170 [160];
  undefined1 local_d0 [160];
  
  std::__cxx11::string::string((string *)&hash_function,"strings",(allocator *)&__msg);
  spelling_ns.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  spelling_ns.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  spelling_ns.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  quadratics.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  quadratics.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  quadratics.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cubics.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cubics.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cubics.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  interactions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  interactions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  interactions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ignores.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ignores.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ignores.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ignore_linears.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ignore_linears.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ignore_linears.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  keeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  keeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  keeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  redefines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  redefines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  redefines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dictionary_nses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dictionary_nses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dictionary_nses.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dictionary_path.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dictionary_path.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dictionary_path.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  affix._M_dataplus._M_p = (pointer)&affix.field_2;
  affix._M_string_length = 0;
  affix.field_2._M_local_buf[0] = '\0';
  q_colon._M_dataplus._M_p = (pointer)&q_colon.field_2;
  q_colon._M_string_length = 0;
  q_colon.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_e08,"Feature options",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&feature_options,&local_e08);
  std::__cxx11::string::~string((string *)&local_e08);
  std::__cxx11::string::string((string *)&local_e28,"hash",&local_17f9);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&__msg,&local_e28,&hash_function);
  local_1700 = true;
  std::__cxx11::string::string
            (local_e48,"how to hash the features. Available options: strings, all",&local_17fa);
  std::__cxx11::string::_M_assign((string *)(local_1760 + 0x20));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (&feature_options,
                      (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&__msg);
  std::__cxx11::string::string((string *)&local_e68,"hash_seed",&local_17fb);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)&exp_cubic,&local_e68,&all->hash_seed);
  op = VW::config::typed_option<unsigned_int>::default_value
                 ((typed_option<unsigned_int> *)&exp_cubic,0);
  std::__cxx11::string::string(local_e88,"seed for hash function",&local_17fc);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (poVar7,op);
  std::__cxx11::string::string((string *)&local_ea8,"ignore",&local_17fd);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_c70,&local_ea8,&ignores);
  local_c00 = true;
  std::__cxx11::string::string
            (local_ec8,"ignore namespaces beginning with character <arg>",&local_17fe);
  std::__cxx11::string::_M_assign((string *)(local_c70 + 0x30));
  poVar7 = VW::config::option_group_definition::
           add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                     (poVar7,(typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_c70);
  std::__cxx11::string::string((string *)&local_ee8,"ignore_linear",&local_17ff);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&expanded_interactions,&local_ee8,&ignore_linears);
  local_d58 = true;
  std::__cxx11::string::string
            (local_f08,"ignore namespaces beginning with character <arg> for linear terms only",
             &local_1800);
  std::__cxx11::string::_M_assign(local_d98);
  poVar7 = VW::config::option_group_definition::
           add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                     (poVar7,(typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&expanded_interactions);
  std::__cxx11::string::string((string *)&local_f28,"keep",&local_1801);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_9b0,&local_f28,&keeps);
  local_940 = true;
  std::__cxx11::string::string
            (local_f48,"keep namespaces beginning with character <arg>",&local_1802);
  std::__cxx11::string::_M_assign((string *)(local_9b0 + 0x30));
  poVar7 = VW::config::option_group_definition::
           add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                     (poVar7,(typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_9b0);
  std::__cxx11::string::string((string *)&local_f68,"redefine",&local_1803);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_a50,&local_f68,&redefines);
  local_9e0 = true;
  std::__cxx11::string::string
            (local_f88,
             "redefine namespaces beginning with characters of string S as namespace N. <arg> shall be in form \'N:=S\' where := is operator. Empty N or S are treated as default namespace. Use \':\' as a wildcard in S."
             ,&local_1804);
  std::__cxx11::string::_M_assign((string *)(local_a50 + 0x30));
  local_9e0 = true;
  poVar7 = VW::config::option_group_definition::
           add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                     (poVar7,(typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_a50);
  std::__cxx11::string::string((string *)&local_fa8,"bit_precision",&local_1805);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_af0,&local_fa8,&new_bits);
  std::__cxx11::string::string(local_fc8,"b",&local_1806);
  std::__cxx11::string::_M_assign(local_aa0);
  std::__cxx11::string::string(local_fe8,"number of bits in the feature table",&local_1807);
  std::__cxx11::string::_M_assign((string *)(local_af0 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (poVar7,(typed_option<unsigned_int> *)local_af0);
  std::__cxx11::string::string((string *)&local_1008,"noconstant",&local_1808);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_d0,&local_1008,&noconstant);
  std::__cxx11::string::string(local_1028,"Don\'t add a constant feature",&local_1809);
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_d0);
  std::__cxx11::string::string((string *)&local_1048,"constant",&local_180a);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_5f0,&local_1048,&all->initial_constant);
  std::__cxx11::string::string(local_1068,"C",&local_180b);
  std::__cxx11::string::_M_assign(local_5a0);
  std::__cxx11::string::string(local_1088,"Set initial value of constant",&local_180c);
  std::__cxx11::string::_M_assign((string *)(local_5f0 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar7,(typed_option<float> *)local_5f0);
  std::__cxx11::string::string((string *)&local_10a8,"ngram",&local_180d);
  pvVar19 = &all->ngram_strings;
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_170,&local_10a8,pvVar19);
  std::__cxx11::string::string
            (local_10c8,
             "Generate N grams. To generate N grams for a single namespace \'foo\', arg should be fN."
             ,&local_180e);
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  poVar7 = VW::config::option_group_definition::
           add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                     (poVar7,(typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_170);
  std::__cxx11::string::string((string *)&local_10e8,"skips",&local_180f);
  location = &all->skip_strings;
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_210,&local_10e8,location);
  std::__cxx11::string::string
            (local_1108,
             "Generate skips in N grams. This in conjunction with the ngram tag can be used to generate generalized n-skip-k-gram. To generate n-skips for a single namespace \'foo\', arg should be fN."
             ,&local_1810);
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  poVar7 = VW::config::option_group_definition::
           add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                     (poVar7,(typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_210);
  std::__cxx11::string::string((string *)&local_1128,"feature_limit",&local_1811);
  local_1830 = (vw *)&all->limit_strings;
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_2b0,&local_1128,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1830);
  std::__cxx11::string::string
            (local_1148,
             "limit to N features. To apply to a single namespace \'foo\', arg should be fN",
             &local_1812);
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  poVar7 = VW::config::option_group_definition::
           add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                     (poVar7,(typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_2b0);
  std::__cxx11::string::string((string *)&local_1168,"affix",&local_1813);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_690,&local_1168,&affix);
  local_620 = true;
  std::__cxx11::string::string
            (local_1188,
             "generate prefixes/suffixes of features; argument \'+2a,-3b,+1\' means generate 2-char prefixes for namespace a, 3-char suffixes for b and 1 char prefixes for default namespace"
             ,&local_1814);
  std::__cxx11::string::_M_assign((string *)(local_690 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar7,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_690);
  std::__cxx11::string::string((string *)&local_11a8,"spelling",&local_1815);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_730,&local_11a8,&spelling_ns);
  local_6c0 = true;
  std::__cxx11::string::string
            (local_11c8,
             "compute spelling features for a give namespace (use \'_\' for default namespace)",
             &local_1816);
  std::__cxx11::string::_M_assign((string *)(local_730 + 0x30));
  poVar7 = VW::config::option_group_definition::
           add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                     (poVar7,(typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_730);
  std::__cxx11::string::string((string *)&local_11e8,"dictionary",&local_1817);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_7d0,&local_11e8,&dictionary_nses);
  local_760 = true;
  std::__cxx11::string::string
            (local_1208,
             "read a dictionary for additional features (arg either \'x:file\' or just \'file\')",
             &local_1818);
  std::__cxx11::string::_M_assign((string *)(local_7d0 + 0x30));
  poVar7 = VW::config::option_group_definition::
           add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                     (poVar7,(typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_7d0);
  std::__cxx11::string::string((string *)&local_1228,"dictionary_path",&local_1819);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_350,&local_1228,&dictionary_path);
  std::__cxx11::string::string
            (local_1248,
             "look in this directory for dictionaries; defaults to current directory or env{PATH}",
             &local_181a);
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  poVar7 = VW::config::option_group_definition::
           add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                     (poVar7,(typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_350);
  std::__cxx11::string::string((string *)&local_1268,"interactions",&local_181b);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_870,&local_1268,&interactions);
  local_800 = true;
  std::__cxx11::string::string
            (local_1288,"Create feature interactions of any level between namespaces.",&local_181c);
  std::__cxx11::string::_M_assign((string *)(local_870 + 0x30));
  poVar7 = VW::config::option_group_definition::
           add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                     (poVar7,(typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_870);
  std::__cxx11::string::string((string *)&local_12a8,"permutations",&local_181d);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3f0,&local_12a8,&all->permutations);
  std::__cxx11::string::string
            (local_12c8,
             "Use permutations instead of combinations for feature interactions of same namespace.",
             &local_181e);
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_3f0);
  std::__cxx11::string::string((string *)&local_12e8,"leave_duplicate_interactions",&local_181f);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_490,&local_12e8,&leave_duplicate_interactions);
  std::__cxx11::string::string
            (local_1308,
             "Don\'t remove interactions with duplicate combinations of namespaces. For ex. this is a duplicate: \'-q ab -q ba\' and a lot more in \'-q ::\'."
             ,&local_1820);
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_490);
  std::__cxx11::string::string((string *)&local_1328,"quadratic",&local_1821);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_b90,&local_1328,&quadratics);
  std::__cxx11::string::string(local_1348,"q",&local_1822);
  std::__cxx11::string::_M_assign(local_b40);
  local_b20 = true;
  std::__cxx11::string::string(local_1368,"Create and use quadratic features",&local_1823);
  std::__cxx11::string::_M_assign((string *)(local_b90 + 0x30));
  poVar7 = VW::config::option_group_definition::
           add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                     (poVar7,(typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_b90);
  std::__cxx11::string::string((string *)&local_1388,"q:",&local_1824);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_530,&local_1388,&q_colon);
  std::__cxx11::string::string
            (local_13a8,": corresponds to a wildcard for all printable characters",&local_1825);
  std::__cxx11::string::_M_assign((string *)(local_530 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar7,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_530);
  std::__cxx11::string::string((string *)&local_13c8,"cubic",&local_1826);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_910,&local_13c8,&cubics);
  local_8a0 = true;
  std::__cxx11::string::string(local_13e8,"Create and use cubic features",&local_1827);
  std::__cxx11::string::_M_assign((string *)(local_910 + 0x30));
  VW::config::option_group_definition::
  add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
            (poVar7,(typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_910);
  std::__cxx11::string::~string(local_13e8);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_910);
  std::__cxx11::string::~string((string *)&local_13c8);
  std::__cxx11::string::~string(local_13a8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_530);
  std::__cxx11::string::~string((string *)&local_1388);
  std::__cxx11::string::~string(local_1368);
  std::__cxx11::string::~string(local_1348);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_b90);
  std::__cxx11::string::~string((string *)&local_1328);
  std::__cxx11::string::~string(local_1308);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_490);
  std::__cxx11::string::~string((string *)&local_12e8);
  std::__cxx11::string::~string(local_12c8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_3f0);
  std::__cxx11::string::~string((string *)&local_12a8);
  std::__cxx11::string::~string(local_1288);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_870);
  std::__cxx11::string::~string((string *)&local_1268);
  std::__cxx11::string::~string(local_1248);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_350);
  std::__cxx11::string::~string((string *)&local_1228);
  std::__cxx11::string::~string(local_1208);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_7d0);
  std::__cxx11::string::~string((string *)&local_11e8);
  std::__cxx11::string::~string(local_11c8);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_730);
  std::__cxx11::string::~string((string *)&local_11a8);
  std::__cxx11::string::~string(local_1188);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_690);
  std::__cxx11::string::~string((string *)&local_1168);
  std::__cxx11::string::~string(local_1148);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_2b0);
  std::__cxx11::string::~string((string *)&local_1128);
  std::__cxx11::string::~string(local_1108);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_210);
  std::__cxx11::string::~string((string *)&local_10e8);
  std::__cxx11::string::~string(local_10c8);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_170);
  std::__cxx11::string::~string((string *)&local_10a8);
  std::__cxx11::string::~string(local_1088);
  std::__cxx11::string::~string(local_1068);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_5f0);
  std::__cxx11::string::~string((string *)&local_1048);
  std::__cxx11::string::~string(local_1028);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_d0);
  std::__cxx11::string::~string((string *)&local_1008);
  std::__cxx11::string::~string(local_fe8);
  std::__cxx11::string::~string(local_fc8);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)local_af0);
  std::__cxx11::string::~string((string *)&local_fa8);
  std::__cxx11::string::~string(local_f88);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_a50);
  std::__cxx11::string::~string((string *)&local_f68);
  std::__cxx11::string::~string(local_f48);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_9b0);
  std::__cxx11::string::~string((string *)&local_f28);
  std::__cxx11::string::~string(local_f08);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&expanded_interactions);
  std::__cxx11::string::~string((string *)&local_ee8);
  std::__cxx11::string::~string(local_ec8);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_c70);
  std::__cxx11::string::~string((string *)&local_ea8);
  std::__cxx11::string::~string(local_e88);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)&exp_cubic);
  std::__cxx11::string::~string((string *)&local_e68);
  std::__cxx11::string::~string(local_e48);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&__msg);
  std::__cxx11::string::~string((string *)&local_e28);
  (**options->_vptr_options_i)(options,&feature_options);
  p_Var8 = getHasher(&hash_function);
  all->p->hasher = p_Var8;
  std::__cxx11::string::string((string *)&__msg,"spelling",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    lVar17 = 0;
    for (uVar24 = 0;
        uVar24 < (ulong)((long)spelling_ns.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)spelling_ns.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar24 = uVar24 + 1)
    {
      spoof_hex_encoded_namespaces
                ((string *)&__msg,
                 (string *)
                 ((long)&((spelling_ns.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar17));
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&((spelling_ns.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar17),
                 (string *)&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      lVar9 = (long)**(char **)((long)&((spelling_ns.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar17);
      if (lVar9 == 0x5f) {
        all->spelling_features[0x20] = true;
      }
      else {
        all->spelling_features[lVar9] = true;
      }
      lVar17 = lVar17 + 0x20;
    }
  }
  std::__cxx11::string::string((string *)&__msg,"affix",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    spoof_hex_encoded_namespaces(&local_1408,&affix);
    parse_affix_argument(all,&local_1408);
    std::__cxx11::string::~string((string *)&local_1408);
  }
  std::__cxx11::string::string((string *)&__msg,"ngram",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    std::__cxx11::string::string((string *)&__msg,"sort_features",(allocator *)&exp_cubic);
    iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar6 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_1760,"ngram is incompatible with sort_features.");
      pvVar13 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar13,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
                 ,0x2aa,&local_cc8);
      __cxa_throw(pvVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    lVar17 = 0;
    for (uVar24 = 0;
        pbVar20 = (all->ngram_strings).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar24 < (ulong)((long)(all->ngram_strings).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20 >> 5);
        uVar24 = uVar24 + 1) {
      spoof_hex_encoded_namespaces
                ((string *)&__msg,(string *)((long)&(pbVar20->_M_dataplus)._M_p + lVar17));
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&(((pvVar19->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar17),
                 (string *)&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      lVar17 = lVar17 + 0x20;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1460,pvVar19);
    compile_gram(&local_1460,all->ngram,"grams",all->quiet);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1460);
  }
  std::__cxx11::string::string((string *)&__msg,"skips",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    std::__cxx11::string::string((string *)&__msg,"ngram",(allocator *)&exp_cubic);
    iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar6 == '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      std::operator<<((ostream *)local_1760,"You can not skip unless ngram is > 1");
      pvVar13 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar13,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
                 ,0x2b4,&local_ce8);
      __cxa_throw(pvVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    lVar17 = 0;
    for (uVar24 = 0;
        pbVar20 = (all->skip_strings).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar24 < (ulong)((long)(all->skip_strings).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar20 >> 5);
        uVar24 = uVar24 + 1) {
      spoof_hex_encoded_namespaces
                ((string *)&__msg,(string *)((long)&(pbVar20->_M_dataplus)._M_p + lVar17));
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&(((location->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar17),
                 (string *)&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      lVar17 = lVar17 + 0x20;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1478,location);
    compile_gram(&local_1478,all->skips,"skips",all->quiet);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1478);
  }
  std::__cxx11::string::string((string *)&__msg,"feature_limit",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1490,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1830);
    compile_limits(&local_1490,all->limit,all->quiet);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1490);
  }
  std::__cxx11::string::string((string *)&__msg,"bit_precision",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  local_1830 = all;
  if ((char)iVar6 != '\0') {
    if ((all->default_bits == false) && (new_bits != all->num_bits)) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      poVar10 = std::operator<<((ostream *)local_1760,"Number of bits is set to ");
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      poVar10 = std::operator<<(poVar10," and ");
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      std::operator<<(poVar10," by argument and model.  That does not work.");
      pvVar13 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar13,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
                 ,0x2c2,&local_d08);
      __cxa_throw(pvVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    all->default_bits = false;
    all->num_bits = new_bits;
    VW::validate_num_bits(all);
  }
  expanded_interactions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expanded_interactions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  expanded_interactions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((((all->pairs).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (all->pairs).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) &&
      ((all->triples).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (all->triples).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) &&
     (bVar16 = interactions_settings_doubled,
     (all->interactions).
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_start ==
     (all->interactions).
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
joined_r0x00166804:
    if (bVar16 == 0) goto LAB_00165958;
  }
  else {
    std::__cxx11::string::string((string *)&__msg,"quadratic",(allocator *)local_9b0);
    iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
    if ((char)iVar6 == '\0') {
      std::__cxx11::string::string((string *)&exp_cubic,"cubic",(allocator *)local_a50);
      iVar6 = (*options->_vptr_options_i[1])(options,&exp_cubic);
      if ((char)iVar6 == '\0') {
        std::__cxx11::string::string((string *)local_c70,"interactions",(allocator *)local_af0);
        iVar6 = (*options->_vptr_options_i[1])(options,local_c70);
        bVar16 = (byte)iVar6 | interactions_settings_doubled;
        std::__cxx11::string::~string((string *)local_c70);
        std::__cxx11::string::~string((string *)&exp_cubic);
        std::__cxx11::string::~string((string *)&__msg);
        bVar16 = bVar16 & 1;
        goto joined_r0x00166804;
      }
      std::__cxx11::string::~string((string *)&exp_cubic);
    }
    std::__cxx11::string::~string((string *)&__msg);
  }
  poVar10 = std::operator<<(&(all->trace_message).super_ostream,
                            "WARNING: model file has set of {-q, --cubic, --interactions} settings stored, but they\'ll be OVERRIDEN by set of {-q, --cubic, --interactions} settings from command line."
                           );
  std::endl<char,std::char_traits<char>>(poVar10);
  if ((all->pairs).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (all->pairs).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&all->pairs);
  }
  if ((all->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (all->triples).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&all->triples);
  }
  if ((all->interactions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (all->interactions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&all->interactions);
  }
LAB_00165958:
  std::__cxx11::string::string((string *)&__msg,"quadratic",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    if (all->quiet == false) {
      std::operator<<(&(all->trace_message).super_ostream,"creating quadratic features for pairs: ")
      ;
    }
    for (pbVar20 = quadratics.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar20 !=
        quadratics.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar20 = pbVar20 + 1) {
      spoof_hex_encoded_namespaces((string *)&__msg,pbVar20);
      std::__cxx11::string::operator=((string *)pbVar20,(string *)&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      if (all->quiet == false) {
        poVar10 = std::operator<<(&(all->trace_message).super_ostream,(string *)pbVar20);
        std::operator<<(poVar10," ");
      }
    }
    std::__cxx11::string::string
              ((string *)&__msg,"error, quadratic features must involve two sets.",
               (allocator *)local_c70);
    INTERACTIONS::expand_interactions(&exp_cubic,&quadratics,2,(string *)&__msg);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(&expanded_interactions,&exp_cubic);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&exp_cubic);
    std::__cxx11::string::~string((string *)&__msg);
    if (all->quiet == false) {
      std::endl<char,std::char_traits<char>>(&(all->trace_message).super_ostream);
    }
  }
  std::__cxx11::string::string((string *)&__msg,"cubic",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    if (all->quiet == false) {
      std::operator<<(&(all->trace_message).super_ostream,"creating cubic features for triples: ");
    }
    for (pbVar20 = cubics.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar20 !=
        cubics.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar20 = pbVar20 + 1) {
      spoof_hex_encoded_namespaces((string *)&__msg,pbVar20);
      std::__cxx11::string::operator=((string *)pbVar20,(string *)&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      if (all->quiet == false) {
        poVar10 = std::operator<<(&(all->trace_message).super_ostream,(string *)pbVar20);
        std::operator<<(poVar10," ");
      }
    }
    std::__cxx11::string::string
              ((string *)&__msg,"error, cubic features must involve three sets.",
               (allocator *)local_c70);
    INTERACTIONS::expand_interactions(&exp_cubic,&cubics,3,(string *)&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &expanded_interactions,
               (const_iterator)
               expanded_interactions.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )exp_cubic.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )exp_cubic.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    if (all->quiet == false) {
      std::endl<char,std::char_traits<char>>(&(all->trace_message).super_ostream);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&exp_cubic);
  }
  std::__cxx11::string::string((string *)&__msg,"interactions",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    if (all->quiet == false) {
      std::operator<<(&(all->trace_message).super_ostream,
                      "creating features for following interactions: ");
    }
    for (pbVar20 = interactions.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar20 !=
        interactions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar20 = pbVar20 + 1) {
      spoof_hex_encoded_namespaces((string *)&__msg,pbVar20);
      std::__cxx11::string::operator=((string *)pbVar20,(string *)&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      if (all->quiet == false) {
        poVar10 = std::operator<<(&(all->trace_message).super_ostream,(string *)pbVar20);
        std::operator<<(poVar10," ");
      }
    }
    std::__cxx11::string::string((string *)&__msg,"",(allocator *)local_c70);
    INTERACTIONS::expand_interactions(&exp_cubic,&interactions,0,(string *)&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &expanded_interactions,
               (const_iterator)
               expanded_interactions.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )exp_cubic.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )exp_cubic.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    if (all->quiet == false) {
      std::endl<char,std::char_traits<char>>(&(all->trace_message).super_ostream);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&exp_cubic);
  }
  if (expanded_interactions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      expanded_interactions.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    INTERACTIONS::sort_and_filter_duplicate_interactions
              (&expanded_interactions,(bool)(leave_duplicate_interactions ^ 1),(size_t *)&__msg,
               (size_t *)&exp_cubic);
    if ((_func_int **)___msg != (_func_int **)0x0) {
      poVar10 = std::operator<<(&(all->trace_message).super_ostream,
                                "WARNING: duplicate namespace interactions were found. Removed: ");
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      poVar10 = std::operator<<(poVar10,'.');
      poVar10 = std::endl<char,std::char_traits<char>>(poVar10);
      poVar10 = std::operator<<(poVar10,
                                "You can use --leave_duplicate_interactions to disable this behaviour."
                               );
      std::endl<char,std::char_traits<char>>(poVar10);
    }
    if (exp_cubic.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      poVar10 = std::operator<<(&(all->trace_message).super_ostream,
                                "WARNING: some interactions contain duplicate characters and their characters order has been changed. Interactions affected: "
                               );
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
      poVar10 = std::operator<<(poVar10,'.');
      std::endl<char,std::char_traits<char>>(poVar10);
    }
    if ((all->interactions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (all->interactions).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&all->interactions);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&all->interactions,&expanded_interactions);
    pbVar20 = expanded_interactions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar23 = expanded_interactions.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar23 != pbVar20;
        pbVar23 = pbVar23 + 1) {
      pvVar19 = &all->triples;
      if ((pbVar23->_M_string_length == 3) ||
         (pvVar19 = &all->pairs, pbVar23->_M_string_length == 2)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(pvVar19,pbVar23);
      }
    }
  }
  for (lVar17 = 0x3b1; lVar17 != 0x4b1; lVar17 = lVar17 + 1) {
    *(undefined1 *)((long)&all->sd + lVar17) = 0;
    (&(all->trace_message).super_ostream.field_0x21)[lVar17] = 0;
  }
  all->ignore_some = false;
  all->ignore_some_linear = false;
  std::__cxx11::string::string((string *)&__msg,"ignore",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    all->ignore_some = true;
    for (pbVar20 = ignores.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar20 !=
        ignores.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar20 = pbVar20 + 1) {
      spoof_hex_encoded_namespaces((string *)&__msg,pbVar20);
      std::__cxx11::string::operator=((string *)pbVar20,(string *)&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      pbVar11 = (byte *)(pbVar20->_M_dataplus)._M_p;
      pbVar14 = pbVar11;
      for (; pbVar11 != pbVar14 + pbVar20->_M_string_length; pbVar11 = pbVar11 + 1) {
        all->ignore[*pbVar11] = true;
        pbVar14 = (byte *)(pbVar20->_M_dataplus)._M_p;
      }
    }
    if (all->quiet == false) {
      pvVar1 = &all->trace_message;
      std::operator<<(&pvVar1->super_ostream,"ignoring namespaces beginning with: ");
      local_17f8 = ignores.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar20 = ignores.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar20 != local_17f8;
          pbVar20 = pbVar20 + 1) {
        pcVar2 = (pbVar20->_M_dataplus)._M_p;
        sVar3 = pbVar20->_M_string_length;
        for (sVar15 = 0; sVar3 != sVar15; sVar15 = sVar15 + 1) {
          poVar10 = std::operator<<(&pvVar1->super_ostream,pcVar2[sVar15]);
          std::operator<<(poVar10," ");
        }
        all = local_1830;
      }
      std::endl<char,std::char_traits<char>>(&pvVar1->super_ostream);
    }
  }
  std::__cxx11::string::string((string *)&__msg,"ignore_linear",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    all->ignore_some_linear = true;
    for (pbVar20 = ignore_linears.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar20 !=
        ignore_linears.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar20 = pbVar20 + 1) {
      spoof_hex_encoded_namespaces((string *)&__msg,pbVar20);
      std::__cxx11::string::operator=((string *)pbVar20,(string *)&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      pbVar11 = (byte *)(pbVar20->_M_dataplus)._M_p;
      pbVar14 = pbVar11;
      for (; pbVar11 != pbVar14 + pbVar20->_M_string_length; pbVar11 = pbVar11 + 1) {
        all->ignore_linear[*pbVar11] = true;
        pbVar14 = (byte *)(pbVar20->_M_dataplus)._M_p;
      }
    }
    if (all->quiet == false) {
      pvVar1 = &all->trace_message;
      std::operator<<(&pvVar1->super_ostream,"ignoring linear terms for namespaces beginning with: "
                     );
      local_17f8 = ignore_linears.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar20 = ignore_linears.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar20 != local_17f8;
          pbVar20 = pbVar20 + 1) {
        pcVar2 = (pbVar20->_M_dataplus)._M_p;
        sVar3 = pbVar20->_M_string_length;
        for (sVar15 = 0; sVar3 != sVar15; sVar15 = sVar15 + 1) {
          poVar10 = std::operator<<(&pvVar1->super_ostream,pcVar2[sVar15]);
          std::operator<<(poVar10," ");
        }
        all = local_1830;
      }
      std::endl<char,std::char_traits<char>>(&pvVar1->super_ostream);
    }
  }
  std::__cxx11::string::string((string *)&__msg,"keep",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 != '\0') {
    for (lVar17 = 0; lVar17 != 0x100; lVar17 = lVar17 + 1) {
      all->ignore[lVar17] = true;
    }
    all->ignore_some = true;
    for (pbVar20 = keeps.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar20 !=
        keeps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar20 = pbVar20 + 1) {
      spoof_hex_encoded_namespaces((string *)&__msg,pbVar20);
      std::__cxx11::string::operator=((string *)pbVar20,(string *)&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      pbVar11 = (byte *)(pbVar20->_M_dataplus)._M_p;
      pbVar14 = pbVar11;
      for (; pbVar11 != pbVar14 + pbVar20->_M_string_length; pbVar11 = pbVar11 + 1) {
        all->ignore[*pbVar11] = false;
        pbVar14 = (byte *)(pbVar20->_M_dataplus)._M_p;
      }
    }
    if (all->quiet == false) {
      pvVar1 = &all->trace_message;
      std::operator<<(&pvVar1->super_ostream,"using namespaces beginning with: ");
      local_17f8 = keeps.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar20 = keeps.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar20 != local_17f8;
          pbVar20 = pbVar20 + 1) {
        pcVar2 = (pbVar20->_M_dataplus)._M_p;
        sVar3 = pbVar20->_M_string_length;
        for (sVar15 = 0; sVar3 != sVar15; sVar15 = sVar15 + 1) {
          poVar10 = std::operator<<(&pvVar1->super_ostream,pcVar2[sVar15]);
          std::operator<<(poVar10," ");
        }
        all = local_1830;
      }
      std::endl<char,std::char_traits<char>>(&pvVar1->super_ostream);
    }
  }
  all->redefine_some = false;
  std::__cxx11::string::string((string *)&__msg,"redefine",(allocator *)&exp_cubic);
  iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar6 == '\0') {
LAB_0016640e:
    std::__cxx11::string::string((string *)&__msg,"dictionary",(allocator *)&exp_cubic);
    iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
    std::__cxx11::string::~string((string *)&__msg);
    if ((char)iVar6 != '\0') {
      std::__cxx11::string::string((string *)&__msg,"dictionary_path",(allocator *)&exp_cubic);
      iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      pbVar20 = dictionary_path.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((char)iVar6 != '\0') {
        local_1830 = (vw *)&all->dictionary_path;
        for (pbVar23 = dictionary_path.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar23 != pbVar20;
            pbVar23 = pbVar23 + 1) {
          std::__cxx11::string::string((string *)&__msg,(string *)pbVar23);
          std::__cxx11::string::string((string *)&local_550,(string *)&__msg);
          bVar5 = directory_exists(&local_550);
          std::__cxx11::string::~string((string *)&local_550);
          if (bVar5) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1830,(value_type *)&__msg);
          }
          std::__cxx11::string::~string((string *)&__msg);
        }
      }
      std::__cxx11::string::string((string *)&local_bb0,".",(allocator *)&__msg);
      bVar5 = directory_exists(&local_bb0);
      std::__cxx11::string::~string((string *)&local_bb0);
      if (bVar5) {
        std::__cxx11::string::string((string *)&__msg,".",(allocator *)&exp_cubic);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &all->dictionary_path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__msg);
        std::__cxx11::string::~string((string *)&__msg);
      }
      pcVar12 = getenv("PATH");
      std::__cxx11::string::string((string *)&__msg,pcVar12,(allocator *)&exp_cubic);
      if (local_1768._M_p != (pointer)0x0) {
        cVar18 = (char)&__msg;
        lVar17 = std::__cxx11::string::find(cVar18,0x3a);
        while (lVar17 != -1) {
          std::__cxx11::string::substr((ulong)&exp_cubic,(ulong)&__msg);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &all->dictionary_path,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exp_cubic
                    );
          std::__cxx11::string::~string((string *)&exp_cubic);
          lVar17 = std::__cxx11::string::find(cVar18,0x3a);
        }
        std::__cxx11::string::substr((ulong)&exp_cubic,(ulong)&__msg);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &all->dictionary_path,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exp_cubic);
        std::__cxx11::string::~string((string *)&exp_cubic);
      }
      lVar17 = 0;
      for (uVar24 = 0;
          uVar24 < (ulong)((long)dictionary_nses.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)dictionary_nses.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5);
          uVar24 = uVar24 + 1) {
        std::__cxx11::string::string
                  ((string *)&local_bd0,
                   (string *)
                   ((long)&((dictionary_nses.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar17)
                  );
        parse_dictionary_argument(all,&local_bd0);
        std::__cxx11::string::~string((string *)&local_bd0);
        lVar17 = lVar17 + 0x20;
      }
      std::__cxx11::string::~string((string *)&__msg);
    }
    if (noconstant == true) {
      all->add_constant = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&expanded_interactions);
    VW::config::option_group_definition::~option_group_definition(&feature_options);
    std::__cxx11::string::~string((string *)&q_colon);
    std::__cxx11::string::~string((string *)&affix);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&dictionary_path);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&dictionary_nses);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&redefines);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&keeps);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ignore_linears);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ignores);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&interactions);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cubics);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&quadratics);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&spelling_ns);
    std::__cxx11::string::~string((string *)&hash_function);
    return;
  }
  for (lVar17 = 0; lVar17 != 0x100; lVar17 = lVar17 + 1) {
    all->redefine[lVar17] = (uchar)lVar17;
  }
  local_1830 = (vw *)&all->trace_message;
  pbVar20 = redefines.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
LAB_001662d6:
  if (pbVar20 !=
      redefines.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    spoof_hex_encoded_namespaces((string *)&exp_cubic,pbVar20);
    pbVar23 = exp_cubic.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = false;
    lVar17 = 0;
LAB_0016630a:
    lVar9 = 0;
    pbVar21 = exp_cubic.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (lVar17 - (long)exp_cubic.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish == lVar9) {
        uVar22 = ' ';
        if (!bVar5) {
          std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
          std::operator<<((ostream *)local_1760,
                          "argument of --redefine is malformed. Valid format is N:=S, :=S or N:=");
          pvVar13 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (pvVar13,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
                     ,0x3a7,&local_d28);
          __cxa_throw(pvVar13,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
LAB_00166369:
        pbVar21 = (pointer)(lVar17 + 1);
        if ((pointer)0x3 < pbVar21) {
          poVar10 = std::operator<<((ostream *)local_1830,
                                    "WARNING: multiple namespaces are used in target part of --redefine argument. Only first one (\'"
                                   );
          poVar10 = std::operator<<(poVar10,uVar22);
          poVar10 = std::operator<<(poVar10,"\') will be used as target namespace.");
          std::endl<char,std::char_traits<char>>(poVar10);
        }
        all->redefine_some = true;
        if (pbVar21 != pbVar23) goto LAB_001663da;
        all->redefine[0x20] = uVar22;
        goto LAB_001663b9;
      }
      if (bVar5) {
        uVar22 = ' ';
        if (2 < (ulong)(lVar17 - lVar9)) {
          uVar22 = *(uchar *)&((exp_cubic.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        }
        goto LAB_00166369;
      }
      cVar18 = *(char *)((long)&(pbVar21->_M_dataplus)._M_p + lVar17);
      if (cVar18 == ':') goto LAB_00166342;
      bVar25 = lVar9 == 0;
      lVar9 = lVar9 + -1;
      bVar4 = bVar5;
      if (bVar25) {
        bVar4 = true;
      }
      if (cVar18 != '=') {
        bVar4 = bVar5;
      }
      bVar5 = bVar4;
      pbVar21 = (pointer)((long)&(pbVar21->_M_dataplus)._M_p + 1);
    } while( true );
  }
  goto LAB_0016640e;
LAB_001663da:
  if (pbVar23 <= pbVar21) goto LAB_001663b9;
  uVar24 = (ulong)*(byte *)((long)&((exp_cubic.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           (long)pbVar21);
  if (uVar24 != 0x3a) {
    all->redefine[uVar24] = uVar22;
    pbVar21 = (pointer)((long)&(pbVar21->_M_dataplus)._M_p + 1);
    goto LAB_001663da;
  }
  for (lVar17 = 0; lVar17 != 0x100; lVar17 = lVar17 + 1) {
    all->redefine[lVar17] = uVar22;
  }
LAB_001663b9:
  std::__cxx11::string::~string((string *)&exp_cubic);
  pbVar20 = pbVar20 + 1;
  goto LAB_001662d6;
LAB_00166342:
  lVar17 = (lVar17 - lVar9) + 1;
  goto LAB_0016630a;
}

Assistant:

void parse_feature_tweaks(options_i& options, vw& all)
{
  string hash_function("strings");
  uint32_t new_bits;
  vector<string> spelling_ns;
  vector<string> quadratics;
  vector<string> cubics;
  vector<string> interactions;
  vector<string> ignores;
  vector<string> ignore_linears;
  vector<string> keeps;
  vector<string> redefines;
  vector<string> dictionary_nses;

  vector<string> dictionary_path;

  bool noconstant;
  bool leave_duplicate_interactions;
  std::string affix;
  std::string q_colon;

  option_group_definition feature_options("Feature options");
  feature_options
      .add(make_option("hash", hash_function).keep().help("how to hash the features. Available options: strings, all"))
      .add(make_option("hash_seed", all.hash_seed).keep().default_value(0).help("seed for hash function"))
      .add(make_option("ignore", ignores).keep().help("ignore namespaces beginning with character <arg>"))
      .add(make_option("ignore_linear", ignore_linears)
               .keep()
               .help("ignore namespaces beginning with character <arg> for linear terms only"))
      .add(make_option("keep", keeps).keep().help("keep namespaces beginning with character <arg>"))
      .add(make_option("redefine", redefines)
               .keep()
               .help("redefine namespaces beginning with characters of string S as namespace N. <arg> shall be in form "
                     "'N:=S' where := is operator. Empty N or S are treated as default namespace. Use ':' as a "
                     "wildcard in S.")
               .keep())
      .add(make_option("bit_precision", new_bits).short_name("b").help("number of bits in the feature table"))
      .add(make_option("noconstant", noconstant).help("Don't add a constant feature"))
      .add(make_option("constant", all.initial_constant).short_name("C").help("Set initial value of constant"))
      .add(make_option("ngram", all.ngram_strings)
               .help("Generate N grams. To generate N grams for a single namespace 'foo', arg should be fN."))
      .add(make_option("skips", all.skip_strings)
               .help("Generate skips in N grams. This in conjunction with the ngram tag can be used to generate "
                     "generalized n-skip-k-gram. To generate n-skips for a single namespace 'foo', arg should be fN."))
      .add(make_option("feature_limit", all.limit_strings)
               .help("limit to N features. To apply to a single namespace 'foo', arg should be fN"))
      .add(make_option("affix", affix)
               .keep()
               .help("generate prefixes/suffixes of features; argument '+2a,-3b,+1' means generate 2-char prefixes for "
                     "namespace a, 3-char suffixes for b and 1 char prefixes for default namespace"))
      .add(make_option("spelling", spelling_ns)
               .keep()
               .help("compute spelling features for a give namespace (use '_' for default namespace)"))
      .add(make_option("dictionary", dictionary_nses)
               .keep()
               .help("read a dictionary for additional features (arg either 'x:file' or just 'file')"))
      .add(make_option("dictionary_path", dictionary_path)
               .help("look in this directory for dictionaries; defaults to current directory or env{PATH}"))
      .add(make_option("interactions", interactions)
               .keep()
               .help("Create feature interactions of any level between namespaces."))
      .add(make_option("permutations", all.permutations)
               .help("Use permutations instead of combinations for feature interactions of same namespace."))
      .add(make_option("leave_duplicate_interactions", leave_duplicate_interactions)
               .help("Don't remove interactions with duplicate combinations of namespaces. For ex. this is a "
                     "duplicate: '-q ab -q ba' and a lot more in '-q ::'."))
      .add(make_option("quadratic", quadratics).short_name("q").keep().help("Create and use quadratic features"))
      // TODO this option is unused - remove?
      .add(make_option("q:", q_colon).help(": corresponds to a wildcard for all printable characters"))
      .add(make_option("cubic", cubics).keep().help("Create and use cubic features"));
  options.add_and_parse(feature_options);

  // feature manipulation
  all.p->hasher = getHasher(hash_function);

  if (options.was_supplied("spelling"))
  {
    for (size_t id = 0; id < spelling_ns.size(); id++)
    {
      spelling_ns[id] = spoof_hex_encoded_namespaces(spelling_ns[id]);
      if (spelling_ns[id][0] == '_')
        all.spelling_features[(unsigned char)' '] = true;
      else
        all.spelling_features[(size_t)spelling_ns[id][0]] = true;
    }
  }

  if (options.was_supplied("affix"))
    parse_affix_argument(all, spoof_hex_encoded_namespaces(affix));

  if (options.was_supplied("ngram"))
  {
    if (options.was_supplied("sort_features"))
      THROW("ngram is incompatible with sort_features.");

    for (size_t i = 0; i < all.ngram_strings.size(); i++)
      all.ngram_strings[i] = spoof_hex_encoded_namespaces(all.ngram_strings[i]);
    compile_gram(all.ngram_strings, all.ngram, (char*)"grams", all.quiet);
  }

  if (options.was_supplied("skips"))
  {
    if (!options.was_supplied("ngram"))
      THROW("You can not skip unless ngram is > 1");

    for (size_t i = 0; i < all.skip_strings.size(); i++)
      all.skip_strings[i] = spoof_hex_encoded_namespaces(all.skip_strings[i]);
    compile_gram(all.skip_strings, all.skips, (char*)"skips", all.quiet);
  }

  if (options.was_supplied("feature_limit"))
    compile_limits(all.limit_strings, all.limit, all.quiet);

  if (options.was_supplied("bit_precision"))
  {
    if (all.default_bits == false && new_bits != all.num_bits)
      THROW("Number of bits is set to " << new_bits << " and " << all.num_bits
                                        << " by argument and model.  That does not work.");

    all.default_bits = false;
    all.num_bits = new_bits;

    VW::validate_num_bits(all);
  }

  // prepare namespace interactions
  std::vector<std::string> expanded_interactions;

  if ( ( ((!all.pairs.empty() || !all.triples.empty() || !all.interactions.empty()) && /*data was restored from old model file directly to v_array and will be overriden automatically*/
          (options.was_supplied("quadratic") || options.was_supplied("cubic") || options.was_supplied("interactions")) ) )
       ||
       interactions_settings_doubled /*settings were restored from model file to file_options and overriden by params from command line*/)
  {
    all.trace_message << "WARNING: model file has set of {-q, --cubic, --interactions} settings stored, but they'll be "
                         "OVERRIDEN by set of {-q, --cubic, --interactions} settings from command line."
                      << endl;

    // in case arrays were already filled in with values from old model file - reset them
    if (!all.pairs.empty())
      all.pairs.clear();
    if (!all.triples.empty())
      all.triples.clear();
    if (!all.interactions.empty())
      all.interactions.clear();
  }

  if (options.was_supplied("quadratic"))
  {
    if (!all.quiet)
      all.trace_message << "creating quadratic features for pairs: ";

    for (vector<string>::iterator i = quadratics.begin(); i != quadratics.end(); ++i)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      if (!all.quiet)
        all.trace_message << *i << " ";
    }

    expanded_interactions =
        INTERACTIONS::expand_interactions(quadratics, 2, "error, quadratic features must involve two sets.");

    if (!all.quiet)
      all.trace_message << endl;
  }

  if (options.was_supplied("cubic"))
  {
    if (!all.quiet)
      all.trace_message << "creating cubic features for triples: ";
    for (vector<string>::iterator i = cubics.begin(); i != cubics.end(); ++i)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      if (!all.quiet)
        all.trace_message << *i << " ";
    }

    std::vector<std::string> exp_cubic =
        INTERACTIONS::expand_interactions(cubics, 3, "error, cubic features must involve three sets.");
    expanded_interactions.insert(std::begin(expanded_interactions), std::begin(exp_cubic), std::end(exp_cubic));

    if (!all.quiet)
      all.trace_message << endl;
  }

  if (options.was_supplied("interactions"))
  {
    if (!all.quiet)
      all.trace_message << "creating features for following interactions: ";
    for (vector<string>::iterator i = interactions.begin(); i != interactions.end(); ++i)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      if (!all.quiet)
        all.trace_message << *i << " ";
    }

    std::vector<std::string> exp_inter = INTERACTIONS::expand_interactions(interactions, 0, "");
    expanded_interactions.insert(std::begin(expanded_interactions), std::begin(exp_inter), std::end(exp_inter));

    if (!all.quiet)
      all.trace_message << endl;
  }

  if (expanded_interactions.size() > 0)
  {
    size_t removed_cnt;
    size_t sorted_cnt;
    INTERACTIONS::sort_and_filter_duplicate_interactions(
        expanded_interactions, !leave_duplicate_interactions, removed_cnt, sorted_cnt);

    if (removed_cnt > 0)
      all.trace_message << "WARNING: duplicate namespace interactions were found. Removed: " << removed_cnt << '.'
                        << endl
                        << "You can use --leave_duplicate_interactions to disable this behaviour." << endl;
    if (sorted_cnt > 0)
      all.trace_message << "WARNING: some interactions contain duplicate characters and their characters order has "
                           "been changed. Interactions affected: "
                        << sorted_cnt << '.' << endl;

    if (all.interactions.size() > 0)
    {
      // should be empty, but just in case...
      all.interactions.clear();
    }

    all.interactions = expanded_interactions;

    // copy interactions of size 2 and 3 to old vectors for backward compatibility
    for (auto& i : expanded_interactions)
    {
      const size_t len = i.size();
      if (len == 2)
        all.pairs.push_back(i);
      else if (len == 3)
        all.triples.push_back(i);
    }
  }

  for (size_t i = 0; i < 256; i++)
  {
    all.ignore[i] = false;
    all.ignore_linear[i] = false;
  }
  all.ignore_some = false;
  all.ignore_some_linear = false;

  if (options.was_supplied("ignore"))
  {
    all.ignore_some = true;

    for (vector<string>::iterator i = ignores.begin(); i != ignores.end(); i++)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      for (string::const_iterator j = i->begin(); j != i->end(); j++) all.ignore[(size_t)(unsigned char)*j] = true;
    }

    if (!all.quiet)
    {
      all.trace_message << "ignoring namespaces beginning with: ";
      for (auto const& ignore : ignores)
        for (auto const character : ignore) all.trace_message << character << " ";

      all.trace_message << endl;
    }
  }

  if (options.was_supplied("ignore_linear"))
  {
    all.ignore_some_linear = true;

    for (vector<string>::iterator i = ignore_linears.begin(); i != ignore_linears.end(); i++)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      for (string::const_iterator j = i->begin(); j != i->end(); j++)
        all.ignore_linear[(size_t)(unsigned char)*j] = true;
    }

    if (!all.quiet)
    {
      all.trace_message << "ignoring linear terms for namespaces beginning with: ";
      for (auto const& ignore : ignore_linears)
        for (auto const character : ignore) all.trace_message << character << " ";

      all.trace_message << endl;
    }
  }

  if (options.was_supplied("keep"))
  {
    for (size_t i = 0; i < 256; i++) all.ignore[i] = true;

    all.ignore_some = true;

    for (vector<string>::iterator i = keeps.begin(); i != keeps.end(); i++)
    {
      *i = spoof_hex_encoded_namespaces(*i);
      for (string::const_iterator j = i->begin(); j != i->end(); j++) all.ignore[(size_t)(unsigned char)*j] = false;
    }

    if (!all.quiet)
    {
      all.trace_message << "using namespaces beginning with: ";
      for (auto const& keep : keeps)
        for (auto const character : keep) all.trace_message << character << " ";

      all.trace_message << endl;
    }
  }

  // --redefine param code
  all.redefine_some = false;  // false by default

  if (options.was_supplied("redefine"))
  {
    // initail values: i-th namespace is redefined to i itself
    for (size_t i = 0; i < 256; i++) all.redefine[i] = (unsigned char)i;

    // note: --redefine declaration order is matter
    // so --redefine :=L --redefine ab:=M  --ignore L  will ignore all except a and b under new M namspace

    for (vector<string>::iterator arg_iter = redefines.begin(); arg_iter != redefines.end(); arg_iter++)
    {
      string argument = spoof_hex_encoded_namespaces(*arg_iter);
      size_t arg_len = argument.length();

      size_t operator_pos = 0;  // keeps operator pos + 1 to stay unsigned type
      bool operator_found = false;
      unsigned char new_namespace = ' ';

      // let's find operator ':=' position in N:=S
      for (size_t i = 0; i < arg_len; i++)
      {
        if (operator_found)
        {
          if (i > 2)
          {
            new_namespace = argument[0];
          }  // N is not empty
          break;
        }
        else if (argument[i] == ':')
          operator_pos = i + 1;
        else if ((argument[i] == '=') && (operator_pos == i))
          operator_found = true;
      }

      if (!operator_found)
        THROW("argument of --redefine is malformed. Valid format is N:=S, :=S or N:=");

      if (++operator_pos > 3)  // seek operator end
        all.trace_message
            << "WARNING: multiple namespaces are used in target part of --redefine argument. Only first one ('"
            << new_namespace << "') will be used as target namespace." << endl;

      all.redefine_some = true;

      // case ':=S' doesn't require any additional code as new_namespace = ' ' by default

      if (operator_pos == arg_len)  // S is empty, default namespace shall be used
        all.redefine[(int)' '] = new_namespace;
      else
        for (size_t i = operator_pos; i < arg_len; i++)
        {
          // all namespaces from S are redefined to N
          unsigned char c = argument[i];
          if (c != ':')
            all.redefine[c] = new_namespace;
          else
          {
            // wildcard found: redefine all except default and break
            for (size_t i = 0; i < 256; i++) all.redefine[i] = new_namespace;
            break;  // break processing S
          }
        }
    }
  }

  if (options.was_supplied("dictionary"))
  {
    if (options.was_supplied("dictionary_path"))
      for (string path : dictionary_path)
        if (directory_exists(path))
          all.dictionary_path.push_back(path);
    if (directory_exists("."))
      all.dictionary_path.push_back(".");

    const std::string PATH = getenv("PATH");
#if _WIN32
    const char delimiter = ';';
#else
    const char delimiter = ':';
#endif
    if (!PATH.empty())
    {
      size_t previous = 0;
      size_t index = PATH.find(delimiter);
      while (index != string::npos)
      {
        all.dictionary_path.push_back(PATH.substr(previous, index - previous));
        previous = index + 1;
        index = PATH.find(delimiter, previous);
      }
      all.dictionary_path.push_back(PATH.substr(previous));
    }

    for (size_t id = 0; id < dictionary_nses.size(); id++) parse_dictionary_argument(all, dictionary_nses[id]);
  }

  if (noconstant)
    all.add_constant = false;
}